

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDTernary(TranslateToFuzzReader *this)

{
  Expression *pEVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  
  pEVar1 = make(this,(Type)0x6);
  pEVar2 = make(this,(Type)0x6);
  pEVar3 = make(this,(Type)0x6);
  pEVar4 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x30,8);
  *(undefined8 *)pEVar4 = 0;
  (pEVar4->type).id = 0;
  *(undefined8 *)(pEVar4 + 1) = 0;
  pEVar4->_id = SIMDTernaryId;
  pEVar4[1].type.id = (uintptr_t)pEVar1;
  *(Expression **)(pEVar4 + 2) = pEVar2;
  pEVar4[2].type.id = (uintptr_t)pEVar3;
  wasm::SIMDTernary::finalize();
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDTernary() {
  // TODO: Enable qfma/qfms once it is implemented in V8 and the interpreter
  // SIMDTernaryOp op = pick(Bitselect,
  //                         QFMAF32x4,
  //                         QFMSF32x4,
  //                         QFMAF64x2,
  //                         QFMSF64x2);
  SIMDTernaryOp op = Bitselect;
  Expression* a = make(Type::v128);
  Expression* b = make(Type::v128);
  Expression* c = make(Type::v128);
  return builder.makeSIMDTernary(op, a, b, c);
}